

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O2

void decode_dblock(void *block)

{
  ushort *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar9 = *block;
  uVar2 = *(ulong *)((long)block + 8);
  uVar4 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
          (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18;
  uVar8 = uVar4 | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  *(ulong *)block = uVar8;
  uVar5 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18;
  uVar7 = uVar5 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  *(ulong *)((long)block + 8) = uVar7;
  uVar3 = *(ulong *)((long)block + 0x10);
  *(ulong *)((long)block + 0x10) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)((long)block + 0x18);
  *(ulong *)((long)block + 0x18) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)((long)block + 0x20);
  *(ulong *)((long)block + 0x20) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)((long)block + 0x28);
  *(ulong *)((long)block + 0x28) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)((long)block + 0x30);
  *(ulong *)((long)block + 0x30) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)((long)block + 0x38);
  *(ulong *)((long)block + 0x38) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)((long)block + 0x40);
  *(ulong *)((long)block + 0x40) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)((long)block + 0x48);
  *(ulong *)((long)block + 0x48) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  puVar1 = (ushort *)((long)block + 0x50);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  puVar1 = (ushort *)((long)block + 0x52);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  if ((uVar9 & 0xff00) == 0) {
    *(ulong *)((long)block + 0xfc5) = uVar8;
    lVar10 = 0;
    uVar9 = 0;
  }
  else {
    lVar10 = (ulong)((uint)(uVar8 >> 0x35) & 7) - 1;
    uVar9 = (ulong)((ushort)(uVar8 >> 0x30) & 0x1f);
    *(ulong *)((long)block + 0xfc5) = uVar4;
  }
  *(long *)((long)block + 0xfcd) = lVar10;
  *(ulong *)((long)block + 0xfd5) = uVar9;
  if ((uVar2 & 0xff00) == 0) {
    *(ulong *)((long)block + 0xfdd) = uVar8;
    lVar10 = 0;
    uVar9 = 0;
  }
  else {
    lVar10 = (ulong)((uint)(uVar7 >> 0x35) & 7) - 1;
    uVar9 = (ulong)((ushort)(uVar7 >> 0x30) & 0x1f);
    *(ulong *)((long)block + 0xfdd) = uVar5;
  }
  *(long *)((long)block + 0xfe5) = lVar10;
  *(ulong *)((long)block + 0xfed) = uVar9;
  uVar9 = *(ulong *)((long)block + 0xff5);
  uVar2 = *(ulong *)((long)block + 0xffd);
  *(ulong *)((long)block + 0xff5) =
       uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
       (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
       (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  *(ulong *)((long)block + 0xffd) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar9 = *(ulong *)((long)block + 0x1007);
  *(ulong *)((long)block + 0x1007) =
       uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
       (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
       (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  uVar6 = *(ushort *)((long)block + 0x1005) << 8 | *(ushort *)((long)block + 0x1005) >> 8;
  *(ushort *)((long)block + 0x1005) = uVar6;
  uVar9 = *(ulong *)((long)block + (ulong)uVar6);
  *(ulong *)((long)block + 0xfb5) =
       uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
       (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
       (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  uVar9 = *(ulong *)((long)block + (ulong)uVar6 + 8);
  *(ulong *)((long)block + 0xfbd) =
       uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
       (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
       (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  return;
}

Assistant:

void decode_dblock(void *block) {
    dblock *_db = (dblock *)block;
    size_t subblock_no, idx;
    _db->trie_root_raw = _endian_decode(_db->trie_root_raw);
    _db->seqtree_root_raw =_endian_decode(_db->seqtree_root_raw);
    _db->staletree_root_raw=_endian_decode(_db->staletree_root_raw);
    _db->num_docs = _endian_decode(_db->num_docs);
    _db->num_deletes = _endian_decode(_db->num_deletes);
    _db->num_nodes = _endian_decode(_db->num_nodes);
    _db->data_size = _endian_decode(_db->data_size);
    _db->last_wal_flush_bid = _endian_decode(_db->
            last_wal_flush_bid);
    _db->kv_info_offset = _endian_decode(_db->kv_info_offset);
    _db->hdr_flags = _endian_decode(_db->hdr_flags);

    _db->new_filename_len = _endian_decode(_db->new_filename_len);
    _db->old_filename_len = _endian_decode(_db->old_filename_len);
    if (!is_subblock(_db->trie_root_raw)) {
        _db->trie_root_bid = _db->trie_root_raw;
        _db->trie_subblock_no = 0;
        _db->trie_idx = 0;
    } else {
        subbid2bid(_db->trie_root_raw,
                   &subblock_no,
                   &idx,
                   &_db->trie_root_bid);
        _db->trie_subblock_no = subblock_no;
        _db->trie_idx = idx;
    }
    if (!is_subblock(_db->seqtree_root_raw)) {
        _db->seqtree_root_bid = _db->trie_root_raw;
        _db->seqtree_subblock_no = 0;
        _db->seqtree_idx = 0;
    } else {
        subbid2bid(_db->seqtree_root_raw,
                   &subblock_no,
                   &idx,
                   &_db->seqtree_root_bid);
        _db->seqtree_subblock_no = subblock_no;
        _db->seqtree_idx = idx;
    }
    _db->delta_size = _endian_decode(_db->delta_size);
    _db->prev_hdr_bid = _endian_decode(_db->prev_hdr_bid);
    _db->magic_bytes = _endian_decode(_db->magic_bytes);
    _db->hdr_len = _endian_decode(_db->hdr_len);
    _db->revnum = *(uint64_t*)((char*)block + _db->hdr_len);
    _db->revnum = _endian_decode(_db->revnum);
    _db->seqnum = *(uint64_t*)((char*)block + _db->hdr_len + sizeof(uint64_t));
    _db->seqnum = _endian_decode(_db->seqnum);
}